

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdata.cpp
# Opt level: O2

void __thiscall
icu_63::CollationData::makeReorderRanges
          (CollationData *this,int32_t *reorder,int32_t length,UBool latinMustMove,UVector32 *ranges
          ,UErrorCode *errorCode)

{
  uint16_t *puVar1;
  uint16_t *puVar2;
  long lVar3;
  int iVar4;
  int32_t i;
  int iVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  uint local_180;
  uint local_174;
  uint local_170;
  uint8_t table [256];
  
  if (U_ZERO_ERROR < *errorCode) {
    return;
  }
  UVector32::removeAllElements(ranges);
  if (length == 0) {
    return;
  }
  if ((length == 1) && (*reorder == 0x67)) {
    return;
  }
  memset(table,0,0x100);
  puVar1 = this->scriptsIndex;
  lVar3 = (long)this->numScripts;
  if ((ulong)puVar1[lVar3 + 0xe] != 0) {
    table[puVar1[lVar3 + 0xe]] = 0xff;
  }
  if ((ulong)puVar1[lVar3 + 0xf] != 0) {
    table[puVar1[lVar3 + 0xf]] = 0xff;
  }
  puVar2 = this->scriptStarts;
  local_180 = (uint)puVar2[1];
  iVar10 = this->scriptStartsLength;
  uVar12 = 0;
  if (0 < length) {
    uVar12 = (ulong)(uint)length;
  }
  local_170 = (uint)puVar2[(long)iVar10 + -1];
  iVar7 = 1;
  uVar11 = 0;
  for (uVar8 = 0; uVar12 != uVar8; uVar8 = uVar8 + 1) {
    uVar9 = 1 << ((byte)reorder[uVar8] & 0x1f);
    if ((reorder[uVar8] & 0xfffffff8U) != 0x1000) {
      uVar9 = 0;
    }
    uVar11 = uVar11 | uVar9;
  }
  for (lVar6 = 0; lVar6 != 8; lVar6 = lVar6 + 1) {
    if ((puVar1[lVar3 + lVar6] != 0) && ((uVar11 >> ((uint)lVar6 & 0x1f) & 1) == 0)) {
      local_180 = addLowScriptRange(this,table,(uint)puVar1[lVar3 + lVar6],local_180);
    }
  }
  if (uVar11 == 0) {
    if ((latinMustMove == '\0') && (*reorder == 0x19)) {
      local_174 = puVar2[puVar1[0x19]] - local_180 & 0xff00;
      local_180 = (uint)puVar2[puVar1[0x19]];
    }
    else {
      local_174 = 0;
    }
  }
  else {
    local_174 = 0;
  }
  uVar8 = 0;
  while( true ) {
    lVar3 = uVar8 << 0x20;
    do {
      lVar3 = lVar3 + 0x100000000;
      if (uVar12 == uVar8) goto LAB_002313ab;
      iVar5 = reorder[uVar8];
      if (iVar5 == -1) goto LAB_0023139b;
      if (iVar5 == 0x67) {
        lVar6 = (long)length;
        goto LAB_00231356;
      }
      uVar11 = getScriptIndex(this,iVar5);
      uVar8 = uVar8 + 1;
    } while (uVar11 == 0);
    if (table[uVar11] != '\0') break;
    local_180 = addLowScriptRange(this,table,uVar11,local_180);
  }
LAB_0023139b:
  *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
  return;
LAB_00231356:
  do {
    if (lVar6 <= lVar3 >> 0x20) {
LAB_002313ab:
      for (lVar3 = 1; lVar3 < (long)iVar10 + -1; lVar3 = lVar3 + 1) {
        if (table[lVar3] == '\0') {
          uVar11 = (uint)puVar2[lVar3];
          if ((int)(uint)puVar2[lVar3] < (int)local_180) {
            uVar11 = local_180;
          }
          if ((long)uVar8 < (long)length) {
            uVar11 = local_180;
          }
          local_180 = addLowScriptRange(this,table,(int32_t)lVar3,uVar11);
        }
      }
      if ((int)local_170 < (int)local_180) {
        if ((int)local_170 < (int)(local_180 - local_174)) {
          *errorCode = U_BUFFER_OVERFLOW_ERROR;
        }
        else {
          makeReorderRanges(this,reorder,length,'\x01',ranges,errorCode);
        }
      }
      else {
        uVar11 = 0;
        do {
          iVar4 = iVar10 + -1;
          lVar3 = (long)iVar7;
          iVar5 = iVar4;
          if (iVar4 < iVar7) {
            iVar5 = iVar7;
          }
          for (; uVar9 = uVar11, lVar3 < iVar4; lVar3 = lVar3 + 1) {
            if ((table[lVar3] != 0xff) &&
               (uVar9 = (uint)table[lVar3] -
                        (uint)*(byte *)((long)this->scriptStarts + lVar3 * 2 + 1), uVar9 != uVar11))
            {
              iVar5 = (int)lVar3;
              break;
            }
          }
          if ((uVar11 != 0) || (iVar5 < iVar4)) {
            UVector32::addElement
                      (ranges,uVar11 & 0xffff | (uint)this->scriptStarts[iVar5] << 0x10,errorCode);
            iVar10 = this->scriptStartsLength;
            iVar4 = iVar10 + -1;
          }
          iVar7 = iVar5 + 1;
          uVar11 = uVar9;
        } while (iVar5 != iVar4);
      }
      return;
    }
    iVar5 = reorder[lVar6 + -1];
    if ((iVar5 == 0x67) || (iVar5 == -1)) goto LAB_0023139b;
    uVar11 = getScriptIndex(this,iVar5);
    lVar6 = lVar6 + -1;
  } while (uVar11 == 0);
  if (table[uVar11] != '\0') goto LAB_0023139b;
  local_170 = addHighScriptRange(this,table,uVar11,local_170);
  goto LAB_00231356;
}

Assistant:

void
CollationData::makeReorderRanges(const int32_t *reorder, int32_t length,
                                 UBool latinMustMove,
                                 UVector32 &ranges, UErrorCode &errorCode) const {
    if(U_FAILURE(errorCode)) { return; }
    ranges.removeAllElements();
    if(length == 0 || (length == 1 && reorder[0] == USCRIPT_UNKNOWN)) {
        return;
    }

    // Maps each script-or-group range to a new lead byte.
    uint8_t table[MAX_NUM_SCRIPT_RANGES];
    uprv_memset(table, 0, sizeof(table));

    {
        // Set "don't care" values for reserved ranges.
        int32_t index = scriptsIndex[
                numScripts + REORDER_RESERVED_BEFORE_LATIN - UCOL_REORDER_CODE_FIRST];
        if(index != 0) {
            table[index] = 0xff;
        }
        index = scriptsIndex[
                numScripts + REORDER_RESERVED_AFTER_LATIN - UCOL_REORDER_CODE_FIRST];
        if(index != 0) {
            table[index] = 0xff;
        }
    }

    // Never reorder special low and high primary lead bytes.
    U_ASSERT(scriptStartsLength >= 2);
    U_ASSERT(scriptStarts[0] == 0);
    int32_t lowStart = scriptStarts[1];
    U_ASSERT(lowStart == ((Collation::MERGE_SEPARATOR_BYTE + 1) << 8));
    int32_t highLimit = scriptStarts[scriptStartsLength - 1];
    U_ASSERT(highLimit == (Collation::TRAIL_WEIGHT_BYTE << 8));

    // Get the set of special reorder codes in the input list.
    // This supports a fixed number of special reorder codes;
    // it works for data with codes beyond UCOL_REORDER_CODE_LIMIT.
    uint32_t specials = 0;
    for(int32_t i = 0; i < length; ++i) {
        int32_t reorderCode = reorder[i] - UCOL_REORDER_CODE_FIRST;
        if(0 <= reorderCode && reorderCode < MAX_NUM_SPECIAL_REORDER_CODES) {
            specials |= (uint32_t)1 << reorderCode;
        }
    }

    // Start the reordering with the special low reorder codes that do not occur in the input.
    for(int32_t i = 0; i < MAX_NUM_SPECIAL_REORDER_CODES; ++i) {
        int32_t index = scriptsIndex[numScripts + i];
        if(index != 0 && (specials & ((uint32_t)1 << i)) == 0) {
            lowStart = addLowScriptRange(table, index, lowStart);
        }
    }

    // Skip the reserved range before Latin if Latin is the first script,
    // so that we do not move it unnecessarily.
    int32_t skippedReserved = 0;
    if(specials == 0 && reorder[0] == USCRIPT_LATIN && !latinMustMove) {
        int32_t index = scriptsIndex[USCRIPT_LATIN];
        U_ASSERT(index != 0);
        int32_t start = scriptStarts[index];
        U_ASSERT(lowStart <= start);
        skippedReserved = start - lowStart;
        lowStart = start;
    }

    // Reorder according to the input scripts, continuing from the bottom of the primary range.
    int32_t originalLength = length;  // length will be decremented if "others" is in the list.
    UBool hasReorderToEnd = FALSE;
    for(int32_t i = 0; i < length;) {
        int32_t script = reorder[i++];
        if(script == USCRIPT_UNKNOWN) {
            // Put the remaining scripts at the top.
            hasReorderToEnd = TRUE;
            while(i < length) {
                script = reorder[--length];
                if(script == USCRIPT_UNKNOWN ||  // Must occur at most once.
                        script == UCOL_REORDER_CODE_DEFAULT) {
                    errorCode = U_ILLEGAL_ARGUMENT_ERROR;
                    return;
                }
                int32_t index = getScriptIndex(script);
                if(index == 0) { continue; }
                if(table[index] != 0) {  // Duplicate or equivalent script.
                    errorCode = U_ILLEGAL_ARGUMENT_ERROR;
                    return;
                }
                highLimit = addHighScriptRange(table, index, highLimit);
            }
            break;
        }
        if(script == UCOL_REORDER_CODE_DEFAULT) {
            // The default code must be the only one in the list, and that is handled by the caller.
            // Otherwise it must not be used.
            errorCode = U_ILLEGAL_ARGUMENT_ERROR;
            return;
        }
        int32_t index = getScriptIndex(script);
        if(index == 0) { continue; }
        if(table[index] != 0) {  // Duplicate or equivalent script.
            errorCode = U_ILLEGAL_ARGUMENT_ERROR;
            return;
        }
        lowStart = addLowScriptRange(table, index, lowStart);
    }

    // Put all remaining scripts into the middle.
    for(int32_t i = 1; i < scriptStartsLength - 1; ++i) {
        int32_t leadByte = table[i];
        if(leadByte != 0) { continue; }
        int32_t start = scriptStarts[i];
        if(!hasReorderToEnd && start > lowStart) {
            // No need to move this script.
            lowStart = start;
        }
        lowStart = addLowScriptRange(table, i, lowStart);
    }
    if(lowStart > highLimit) {
        if((lowStart - (skippedReserved & 0xff00)) <= highLimit) {
            // Try not skipping the before-Latin reserved range.
            makeReorderRanges(reorder, originalLength, TRUE, ranges, errorCode);
            return;
        }
        // We need more primary lead bytes than available, despite the reserved ranges.
        errorCode = U_BUFFER_OVERFLOW_ERROR;
        return;
    }

    // Turn lead bytes into a list of (limit, offset) pairs.
    // Encode each pair in one list element:
    // Upper 16 bits = limit, lower 16 = signed lead byte offset.
    int32_t offset = 0;
    for(int32_t i = 1;; ++i) {
        int32_t nextOffset = offset;
        while(i < scriptStartsLength - 1) {
            int32_t newLeadByte = table[i];
            if(newLeadByte == 0xff) {
                // "Don't care" lead byte for reserved range, continue with current offset.
            } else {
                nextOffset = newLeadByte - (scriptStarts[i] >> 8);
                if(nextOffset != offset) { break; }
            }
            ++i;
        }
        if(offset != 0 || i < scriptStartsLength - 1) {
            ranges.addElement(((int32_t)scriptStarts[i] << 16) | (offset & 0xffff), errorCode);
        }
        if(i == scriptStartsLength - 1) { break; }
        offset = nextOffset;
    }
}